

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawn_location.hpp
# Opt level: O3

SpawnLocation * SpawnLocation::from_json(string *id,Json *json)

{
  pointer pcVar1;
  uchar uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint16_t uVar6;
  const_reference pvVar7;
  SpawnLocation *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uchar ret_4;
  unsigned_short ret;
  uchar local_b1;
  key_type local_b0;
  key_type local_90;
  pointer local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  pointer local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  paVar9 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"mapId","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_b0);
  local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffffffff0000;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
            (pvVar7,(unsigned_short *)&local_90);
  uVar6 = (uint16_t)local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar9) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"posX","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_b0);
  local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_90);
  uVar3 = (uint8_t)local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar9) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"posY","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_b0);
  local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_90);
  uVar4 = (uint8_t)local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar9) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"orientation","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_b0);
  local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_90);
  uVar5 = (uint8_t)local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar9) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  paVar9 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nodeId","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_90);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_b0,pvVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar9) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"startingLife","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_90);
  local_b1 = '\0';
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,&local_b1);
  uVar2 = local_b1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar9) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = (SpawnLocation *)operator_new(0x50);
  pcVar1 = (id->_M_dataplus)._M_p;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + id->_M_string_length);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  paVar9 = &(pSVar8->_id).field_2;
  (pSVar8->_id)._M_dataplus._M_p = (pointer)paVar9;
  if (local_70 == &local_60) {
    paVar9->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&(pSVar8->_id).field_2 + 8) = uStack_58;
  }
  else {
    (pSVar8->_id)._M_dataplus._M_p = local_70;
    (pSVar8->_id).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  (pSVar8->_id)._M_string_length = local_68;
  local_68 = 0;
  local_60 = '\0';
  pSVar8->_map_id = uVar6;
  pSVar8->_pos_x = uVar3;
  pSVar8->_pos_y = uVar4;
  pSVar8->_orientation = uVar5;
  paVar9 = &(pSVar8->_node_id).field_2;
  (pSVar8->_node_id)._M_dataplus._M_p = (pointer)paVar9;
  if (local_50 == &local_40) {
    paVar9->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(pSVar8->_node_id).field_2 + 8) = uStack_38;
  }
  else {
    (pSVar8->_node_id)._M_dataplus._M_p = local_50;
    (pSVar8->_node_id).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (pSVar8->_node_id)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  pSVar8->_starting_life = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    local_70 = &local_60;
    local_50 = &local_40;
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return pSVar8;
}

Assistant:

static SpawnLocation* from_json(const std::string& id, const Json& json)
    {
        uint16_t map_id = json.at("mapId");
        uint8_t pos_x = json.at("posX");
        uint8_t pos_y = json.at("posY");
        uint8_t orientation = json.at("orientation");
        const std::string& node_id = json.at("nodeId");
        uint8_t starting_life = json.at("startingLife");

        return new SpawnLocation(id, map_id, pos_x, pos_y, orientation, starting_life, node_id);
    }